

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase683::TestCase683(TestCase683 *this)

{
  TestCase683 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x2ab,"legacy test: Async/ArrayJoin");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bef708;
  return;
}

Assistant:

TEST(Async, ArrayJoin) {
  for (auto specificJoinPromisesOverload: {
    +[](kj::Array<kj::Promise<int>> promises) { return joinPromises(kj::mv(promises)); },
    +[](kj::Array<kj::Promise<int>> promises) { return joinPromisesFailFast(kj::mv(promises)); }
  }) {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto builder = heapArrayBuilder<Promise<int>>(3);
    builder.add(123);
    builder.add(456);
    builder.add(789);

    Promise<Array<int>> promise = specificJoinPromisesOverload(builder.finish());

    auto result = promise.wait(waitScope);

    ASSERT_EQ(3u, result.size());
    EXPECT_EQ(123, result[0]);
    EXPECT_EQ(456, result[1]);
    EXPECT_EQ(789, result[2]);
  }
}